

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O2

String * anon_unknown.dwarf_155f46::combineStrings
                   (String *__return_storage_ptr__,
                   vector<sf::String,_std::allocator<sf::String>_> *stringArray)

{
  long lVar1;
  char *ansiString;
  ulong uVar2;
  locale local_78 [8];
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_70
  ;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_50
  ;
  
  sf::String::String(__return_storage_ptr__);
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(stringArray->
                            super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(stringArray->
                            super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    ansiString = "\n";
    if (uVar2 == 0) {
      ansiString = "";
    }
    std::locale::locale(local_78);
    sf::String::String((String *)&local_70,ansiString,local_78);
    sf::operator+((String *)&local_50,(String *)&local_70,
                  (String *)
                  ((long)&(((stringArray->
                            super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
                            super__Vector_impl_data._M_start)->m_string)._M_dataplus._M_p + lVar1));
    sf::String::operator+=(__return_storage_ptr__,(String *)&local_50);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string(&local_50);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    ~basic_string(&local_70);
    std::locale::~locale(local_78);
    lVar1 = lVar1 + 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

sf::String combineStrings(const std::vector<sf::String>& stringArray) {
    sf::String str;
    for (size_t i = 0; i < stringArray.size(); ++i) {
        str += (i == 0 ? "" : "\n") + stringArray[i];
    }
    return str;
}